

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fltnode.c
# Opt level: O0

int main(int argc,char **argv)

{
  prf_cb_t callback;
  int iVar1;
  bool_t bVar2;
  bfile_t *pbVar3;
  undefined8 *in_RSI;
  int in_EDI;
  prf_cb_t loadCB;
  bfile_t *file;
  prf_model_t *model;
  bfile_t *in_stack_00000050;
  prf_model_t *in_stack_00000058;
  _func_int_void_ptr_void_ptr *in_stack_00000060;
  void *in_stack_00000068;
  code *model_00;
  int local_4;
  
  if (in_EDI == 3) {
    iVar1 = atoi((char *)in_RSI[1]);
    position = (long)iVar1;
    prf_init();
    prf_model_create();
    prf_model_poolmem((prf_model_t *)0x1023df);
    pbVar3 = bf_create_r((char *)in_stack_00000060);
    if (pbVar3 == (bfile_t *)0x0) {
      printf("Error: Could not open \'%s\' for loading.\n",in_RSI[2]);
      prf_exit();
      local_4 = -1;
    }
    else {
      model_00 = ::callback;
      callback.data = in_stack_00000068;
      callback.func = in_stack_00000060;
      bVar2 = prf_model_load_with_callback(in_stack_00000058,in_stack_00000050,callback);
      if (bVar2 == 0) {
        printf("Error: Couldn\'t parse model.\n");
        prf_model_destroy((prf_model_t *)model_00);
        bf_destroy((bfile_t *)0x102479);
        prf_exit();
        local_4 = -1;
      }
      else {
        bf_destroy((bfile_t *)0x102492);
        prf_model_destroy((prf_model_t *)model_00);
        prf_exit();
        local_4 = 0;
      }
    }
  }
  else {
    printf("Usage: %s <pos> <inputfile>\n",*in_RSI);
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int main(int argc, char ** argv )
{
  prf_model_t * model;
  bfile_t * file;
  prf_cb_t loadCB;

  if ( argc != 3 ) {
    printf( "Usage: %s <pos> <inputfile>\n", argv[0] );
    return -1;
  }

  position = atoi( argv[1] );

  prf_init();

  model = prf_model_create();
  prf_model_poolmem( model );

  file = bf_create_r( argv[2] );
  if ( ! file ) {
    printf( "Error: Could not open '%s' for loading.\n", argv[2] );
    prf_exit();
    return -1;
  }

  prf_cb_set( loadCB, callback, file );

  if ( ! prf_model_load_with_callback( model, file, loadCB ) ) {
    printf( "Error: Couldn't parse model.\n" );
    prf_model_destroy( model );
    bf_destroy( file );
    prf_exit();
    return -1;
  }
  bf_destroy( file );

  prf_model_destroy( model );
  prf_exit();

  return 0;
}